

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtMan.c
# Opt level: O3

Rwt_Man_t * Rwt_ManStart(int fPrecompute)

{
  int iVar1;
  Rwt_Man_t *p;
  char *pcVar2;
  Rwt_Node_t **ppRVar3;
  Mem_Fixed_t *pMVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  char **ppcVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  timespec ts;
  timespec local_38;
  
  clock_gettime(3,&local_38);
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  p = (Rwt_Man_t *)calloc(1,0x480);
  p->nFuncs = 0x10000;
  if (s_puCanons == (unsigned_short *)0x0) {
    Extra_Truth4VarNPN(&s_puCanons,&s_pPhases,&s_pPerms,&s_pMap);
  }
  p->puCanons = s_puCanons;
  p->pPhases = s_pPhases;
  p->pPerms = s_pPerms;
  p->pMap = s_pMap;
  pcVar2 = Rwt_ManGetPractical(p);
  p->pPractical = pcVar2;
  ppRVar3 = (Rwt_Node_t **)calloc(1,(long)p->nFuncs << 3);
  p->pTable = ppRVar3;
  pMVar4 = Mem_FixedStart(0x28);
  p->pMmNode = pMVar4;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  p->vForest = pVVar5;
  Rwt_ManAddVar(p,0,fPrecompute);
  Rwt_ManAddVar(p,0xaaaa,fPrecompute);
  Rwt_ManAddVar(p,0xcccc,fPrecompute);
  Rwt_ManAddVar(p,0xf0f0,fPrecompute);
  Rwt_ManAddVar(p,0xff00,fPrecompute);
  p->nClasses = 5;
  p->nTravIds = 1;
  ppcVar7 = Extra_Permutations(4);
  p->pPerms4 = ppcVar7;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x32;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(200);
  pVVar8->pArray = piVar9;
  p->vLevNums = pVVar8;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x32;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(400);
  pVVar5->pArray = ppvVar6;
  p->vFanins = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x32;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(400);
  pVVar5->pArray = ppvVar6;
  p->vFaninsCur = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x32;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(400);
  pVVar5->pArray = ppvVar6;
  p->vNodesTemp = pVVar5;
  if (fPrecompute == 0) {
    Rwt_ManLoadFromArray(p,0);
    Rwt_ManPreprocess(p);
  }
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeStart = lVar11 + lVar10;
  return p;
}

Assistant:

Rwt_Man_t * Rwt_ManStart( int fPrecompute )
{
    Rwt_Man_t * p;
    abctime clk = Abc_Clock();
clk = Abc_Clock();
    p = ABC_ALLOC( Rwt_Man_t, 1 );
    memset( p, 0, sizeof(Rwt_Man_t) );
    p->nFuncs = (1<<16);
    // copy the global tables
    Rwt_ManGlobalStart();
    p->puCanons = s_puCanons; 
    p->pPhases  = s_pPhases; 
    p->pPerms   = s_pPerms; 
    p->pMap     = s_pMap; 
    // initialize practical NPN classes
    p->pPractical  = Rwt_ManGetPractical( p );
    // create the table
    p->pTable = ABC_ALLOC( Rwt_Node_t *, p->nFuncs );
    memset( p->pTable, 0, sizeof(Rwt_Node_t *) * p->nFuncs );
    // create the elementary nodes
    p->pMmNode  = Mem_FixedStart( sizeof(Rwt_Node_t) );
    p->vForest  = Vec_PtrAlloc( 100 );
    Rwt_ManAddVar( p, 0x0000, fPrecompute ); // constant 0
    Rwt_ManAddVar( p, 0xAAAA, fPrecompute ); // var A
    Rwt_ManAddVar( p, 0xCCCC, fPrecompute ); // var B
    Rwt_ManAddVar( p, 0xF0F0, fPrecompute ); // var C
    Rwt_ManAddVar( p, 0xFF00, fPrecompute ); // var D
    p->nClasses = 5;
    // other stuff
    p->nTravIds   = 1;
    p->pPerms4    = Extra_Permutations( 4 );
    p->vLevNums   = Vec_IntAlloc( 50 );
    p->vFanins    = Vec_PtrAlloc( 50 );
    p->vFaninsCur = Vec_PtrAlloc( 50 );
    p->vNodesTemp = Vec_PtrAlloc( 50 );
    if ( fPrecompute )
    {   // precompute subgraphs
//        Rwt_ManPrecompute( p );
//        Rwt_ManPrint( p );
//        Rwt_ManWriteToArray( p );
    }
    else
    {   // load saved subgraphs
        Rwt_ManLoadFromArray( p, 0 );
//        Rwt_ManPrint( p );
        Rwt_ManPreprocess( p );
    }
p->timeStart = Abc_Clock() - clk;
    return p;
}